

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  vector<std::variant<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>,_std::allocator<std::variant<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>_>_>
  *pvVar1;
  socklen_t in_ECX;
  sockaddr *__addr;
  resultset<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
  *prVar2;
  string_view query_string;
  string_view query_string_00;
  string_view statement;
  string_view statement_00;
  io_context ctx;
  prepared_statement<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
  stmt;
  array<std::variant<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>,_2UL>
  select_values;
  array<std::variant<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>,_2UL>
  update_values;
  undefined1 local_198 [8];
  undefined1 local_190 [112];
  resultset<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
  result;
  connection<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
  conn;
  endpoint ep;
  
  boost::asio::io_context::io_context(&ctx);
  psql::
  connection<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>
  ::connection<boost::asio::io_context&>
            ((connection<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>
              *)&conn,&ctx);
  result.channel_ = (channel_type *)0x100007f00000000;
  result.meta_.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  result.meta_.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  result.meta_.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  boost::asio::ip::detail::endpoint::endpoint(&ep.impl_,(address *)&result,0x1538);
  boost::asio::
  basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::connect((basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
             *)&conn,(int)&ep.impl_,__addr,in_ECX);
  result.channel_ = (channel_type *)0x8;
  result.meta_.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = "postgres";
  result.meta_.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x8;
  result.meta_.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = "postgres";
  result.meta_.fields_.
  super__Vector_base<psql::field_metadata,_std::allocator<psql::field_metadata>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x7;
  result.meta_.fields_.
  super__Vector_base<psql::field_metadata,_std::allocator<psql::field_metadata>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)anon_var_dwarf_1e473;
  psql::
  connection<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
  ::handshake(&conn,(connection_params *)&result);
  query_string._M_str = "UPDATE mytable SET f1 = 100 WHERE f2 = \'adios\'";
  query_string._M_len = 0x2e;
  psql::
  connection<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
  ::query(&result,&conn,query_string);
  while( true ) {
    pvVar1 = &psql::
              resultset<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
              ::fetch_one(&result)->values_;
    if (pvVar1 == (vector<std::variant<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>,_std::allocator<std::variant<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>_>_>
                   *)0x0) break;
    print(pvVar1);
  }
  std::operator<<((ostream *)&std::cout,"UPDATE complete\n\n");
  query_string_00._M_str = "SELECT * FROM \"mytable\";";
  query_string_00._M_len = 0x18;
  psql::
  connection<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
  ::query((resultset<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
           *)local_190,&conn,query_string_00);
  psql::
  resultset<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
  ::operator=(&result,(resultset<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
                       *)local_190);
  psql::
  resultset<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
  ::~resultset((resultset<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
                *)local_190);
  while( true ) {
    pvVar1 = &psql::
              resultset<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
              ::fetch_one(&result)->values_;
    if (pvVar1 == (vector<std::variant<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>,_std::allocator<std::variant<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>_>_>
                   *)0x0) break;
    print(pvVar1);
  }
  std::operator<<((ostream *)&std::cout,"SELECT complete\n\n");
  update_values._M_elems[1].
  super__Variant_base<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  .
  super__Move_assign_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  .
  super__Copy_assign_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  .
  super__Move_ctor_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  .
  super__Copy_ctor_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  .
  super__Variant_storage_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  ._M_u._8_8_ = anon_var_dwarf_1e4e2;
  update_values._M_elems[1].
  super__Variant_base<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  .
  super__Move_assign_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  .
  super__Copy_assign_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  .
  super__Move_ctor_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  .
  super__Copy_ctor_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  .
  super__Variant_storage_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  ._M_index = '\x04';
  update_values._M_elems[1].
  super__Variant_base<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  .
  super__Move_assign_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  .
  super__Copy_assign_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  .
  super__Move_ctor_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  .
  super__Copy_ctor_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  .
  super__Variant_storage_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  ._17_7_ = 0;
  update_values._M_elems[0].
  super__Variant_base<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  .
  super__Move_assign_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  .
  super__Copy_assign_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  .
  super__Move_ctor_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  .
  super__Copy_ctor_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  .
  super__Variant_storage_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  ._M_index = '\0';
  update_values._M_elems[0].
  super__Variant_base<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  .
  super__Move_assign_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  .
  super__Copy_assign_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  .
  super__Move_ctor_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  .
  super__Copy_ctor_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  .
  super__Variant_storage_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  ._17_7_ = 0;
  update_values._M_elems[1].
  super__Variant_base<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  .
  super__Move_assign_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  .
  super__Copy_assign_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  .
  super__Move_ctor_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  .
  super__Copy_ctor_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  .
  super__Variant_storage_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  ._M_u._M_rest._0_8_ = (undefined8)5;
  update_values._M_elems[0].
  super__Variant_base<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  .
  super__Move_assign_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  .
  super__Copy_assign_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  .
  super__Move_ctor_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  .
  super__Copy_ctor_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  .
  super__Variant_storage_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  ._M_u._M_rest._0_8_ = (undefined8)0x96;
  update_values._M_elems[0].
  super__Variant_base<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  .
  super__Move_assign_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  .
  super__Copy_assign_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  .
  super__Move_ctor_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  .
  super__Copy_ctor_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  .
  super__Variant_storage_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  ._M_u._8_8_ = 0;
  statement._M_str = "UPDATE mytable SET f1 = $1 WHERE f2 = $2";
  statement._M_len = 0x28;
  psql::
  connection<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
  ::prepare_statement(&stmt,&conn,statement);
  psql::
  prepared_statement<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>
  ::
  execute<std::variant<int,long,unsigned_int,unsigned_long,std::basic_string_view<char,std::char_traits<char>>,float,double,std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<int,std::ratio<86400l,1l>>>,std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000l>>>,std::chrono::duration<long,std::ratio<1l,1000000l>>,decltype(nullptr)>*>
            ((resultset<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
              *)local_190,&stmt,update_values._M_elems,
             (variant<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
              *)local_198);
  prVar2 = (resultset<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
            *)local_190;
  psql::
  resultset<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
  ::operator=(&result,(resultset<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
                       *)local_190);
  psql::
  resultset<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
  ::~resultset((resultset<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
                *)local_190);
  while( true ) {
    pvVar1 = &psql::
              resultset<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
              ::fetch_one(&result)->values_;
    if (pvVar1 == (vector<std::variant<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>,_std::allocator<std::variant<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>_>_>
                   *)0x0) break;
    print(pvVar1);
  }
  psql::
  prepared_statement<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
  ::close(&stmt,(int)prVar2);
  std::operator<<((ostream *)&std::cout,"Prepared UPDATE complete\n\n");
  select_values._M_elems[1].
  super__Variant_base<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  .
  super__Move_assign_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  .
  super__Copy_assign_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  .
  super__Move_ctor_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  .
  super__Copy_ctor_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  .
  super__Variant_storage_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  ._M_u._8_8_ = anon_var_dwarf_1e546;
  select_values._M_elems[1].
  super__Variant_base<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  .
  super__Move_assign_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  .
  super__Copy_assign_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  .
  super__Move_ctor_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  .
  super__Copy_ctor_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  .
  super__Variant_storage_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  ._M_index = '\x04';
  select_values._M_elems[1].
  super__Variant_base<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  .
  super__Move_assign_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  .
  super__Copy_assign_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  .
  super__Move_ctor_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  .
  super__Copy_ctor_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  .
  super__Variant_storage_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  ._17_7_ = 0;
  select_values._M_elems[0].
  super__Variant_base<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  .
  super__Move_assign_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  .
  super__Copy_assign_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  .
  super__Move_ctor_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  .
  super__Copy_ctor_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  .
  super__Variant_storage_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  ._M_index = '\x04';
  select_values._M_elems[0].
  super__Variant_base<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  .
  super__Move_assign_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  .
  super__Copy_assign_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  .
  super__Move_ctor_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  .
  super__Copy_ctor_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  .
  super__Variant_storage_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  ._17_7_ = 0;
  select_values._M_elems[1].
  super__Variant_base<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  .
  super__Move_assign_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  .
  super__Copy_assign_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  .
  super__Move_ctor_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  .
  super__Copy_ctor_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  .
  super__Variant_storage_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  ._M_u._M_rest._0_8_ = (undefined8)6;
  select_values._M_elems[0].
  super__Variant_base<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  .
  super__Move_assign_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  .
  super__Copy_assign_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  .
  super__Move_ctor_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  .
  super__Copy_ctor_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  .
  super__Variant_storage_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  ._M_u._M_rest._0_8_ = (undefined8)4;
  select_values._M_elems[0].
  super__Variant_base<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  .
  super__Move_assign_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  .
  super__Copy_assign_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  .
  super__Move_ctor_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  .
  super__Copy_ctor_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  .
  super__Variant_storage_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  ._M_u._8_8_ = anon_var_dwarf_1e52d;
  statement_00._M_str = "SELECT * FROM mytable WHERE f2 IN ($1, $2)";
  statement_00._M_len = 0x2a;
  psql::
  connection<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
  ::prepare_statement((prepared_statement<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
                       *)local_190,&conn,statement_00);
  psql::
  prepared_statement<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
  ::operator=(&stmt,(prepared_statement<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
                     *)local_190);
  std::__cxx11::string::~string((string *)(local_190 + 8));
  psql::
  prepared_statement<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>
  ::
  execute<std::variant<int,long,unsigned_int,unsigned_long,std::basic_string_view<char,std::char_traits<char>>,float,double,std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<int,std::ratio<86400l,1l>>>,std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000l>>>,std::chrono::duration<long,std::ratio<1l,1000000l>>,decltype(nullptr)>*>
            ((resultset<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
              *)local_190,&stmt,select_values._M_elems,update_values._M_elems);
  prVar2 = (resultset<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
            *)local_190;
  psql::
  resultset<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
  ::operator=(&result,(resultset<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
                       *)local_190);
  psql::
  resultset<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
  ::~resultset((resultset<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
                *)local_190);
  while( true ) {
    pvVar1 = &psql::
              resultset<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
              ::fetch_one(&result)->values_;
    if (pvVar1 == (vector<std::variant<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>,_std::allocator<std::variant<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>_>_>
                   *)0x0) break;
    print(pvVar1);
  }
  psql::
  prepared_statement<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
  ::close(&stmt,(int)prVar2);
  std::operator<<((ostream *)&std::cout,"Prepared SELECT complete\n\n");
  std::__cxx11::string::~string((string *)&stmt.name_);
  psql::
  resultset<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
  ::~resultset(&result);
  psql::
  connection<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
  ::~connection(&conn);
  boost::asio::execution_context::~execution_context(&ctx.super_execution_context);
  return 0;
}

Assistant:

int main()
{
	// Connection
	net::io_context ctx;
	connection<tcp::socket> conn (ctx);
	boost::asio::ip::tcp::endpoint ep (boost::asio::ip::address_v4::loopback(), 5432);

	// Handshake
	conn.next_layer().connect(ep);
	conn.handshake(connection_params{
		"postgres",
		"postgres",
		"awesome"
	});

	// Query (resultset without fields)
	auto result = conn.query("UPDATE mytable SET f1 = 100 WHERE f2 = 'adios'");
	while (const row* r = result.fetch_one())
	{
		print(r->values());
	}
	std::cout << "UPDATE complete\n\n";

	// Query (resultset with fields)
	result = conn.query("SELECT * FROM \"mytable\";");
	while (const row* r = result.fetch_one())
	{
		print(r->values());
	}
	std::cout << "SELECT complete\n\n";

	// Prepared statement (resultset without fields)
	std::array<value, 2> update_values { value(150), value("adios") };
	auto stmt = conn.prepare_statement("UPDATE mytable SET f1 = $1 WHERE f2 = $2");
	result = stmt.execute(std::begin(update_values), std::end(update_values));
	while (const row* r = result.fetch_one())
	{
		print(r->values());
	}
	stmt.close();
	std::cout << "Prepared UPDATE complete\n\n";


	std::array<value, 2> select_values { value("hola"), value("quetal") };
	stmt = conn.prepare_statement("SELECT * FROM mytable WHERE f2 IN ($1, $2)");
	result = stmt.execute(std::begin(select_values), std::end(select_values));
	while (const row* r = result.fetch_one())
	{
		print(r->values());
	}
	stmt.close();
	std::cout << "Prepared SELECT complete\n\n";
}